

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  long lVar3;
  TestError *this_00;
  long *plVar4;
  long *plVar5;
  long lVar6;
  size_type *psVar7;
  string shader_body;
  string shader_source;
  string variable_basenames [4];
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long local_110;
  ExpressionsAssignment2<glcts::ArraysOfArrays::Interface::GL> *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_108 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,
             "    float a[2] = float[](1.0, 2.0);\n    float b[2][2] = float[][](float[](1.0, 2.0), float[](1.0, 2.0));\n    float c[2][2][2] = float[][][](float[][](float[](1.0, 2.0), float[](1.0, 2.0)),float[][](float[](1.0, 2.0), float[](1.0, 2.0)));\n    float d[2][2][2][2] = float[][][][](float[][][](float[][](float[](1.0, 2.0), float[](1.0, 2.0)), float[][](float[](1.0, 2.0), float[](1.0, 2.0))),float[][][](float[][](float[](1.0, 2.0), float[](1.0, 2.0)), float[][](float[](1.0, 2.0), float[](1.0, 2.0))));\n\n"
             ,"");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"a","");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"b","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"c","");
  plVar5 = local_48;
  local_58[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"d","");
  local_138 = 0x80;
  psVar7 = &local_b8._M_string_length;
  lVar3 = 0;
  do {
    local_100 = &local_98 + lVar3 + -1;
    lVar6 = 0;
    local_110 = lVar3;
    do {
      std::operator+(&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &shader_start_abi_cxx11_,&local_130);
      if (lVar6 != 0) {
        std::operator+(&local_f8,"    ",local_100);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_f8);
        local_178 = &local_168;
        plVar4 = plVar1 + 2;
        if ((long *)*plVar1 == plVar4) {
          local_168 = *plVar4;
          lStack_160 = plVar1[3];
        }
        else {
          local_168 = *plVar4;
          local_178 = (long *)*plVar1;
        }
        local_170 = plVar1[1];
        *plVar1 = (long)plVar4;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_178,*(ulong *)((long)psVar7 + lVar6 + -8));
        local_158 = &local_148;
        plVar4 = plVar1 + 2;
        if ((long *)*plVar1 == plVar4) {
          local_148 = *plVar4;
          lStack_140 = plVar1[3];
        }
        else {
          local_148 = *plVar4;
          local_158 = (long *)*plVar1;
        }
        local_150 = plVar1[1];
        *plVar1 = (long)plVar4;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_158);
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_d8);
        puVar2 = &set_tesseation_abi_cxx11_;
        switch((ulong)tested_shader_type) {
        case 0:
        case 2:
        case 5:
          break;
        case 1:
          std::__cxx11::string::append((char *)&local_d8);
          break;
        case 3:
          puVar2 = &emit_quad_abi_cxx11_;
        case 4:
          std::__cxx11::string::_M_append((char *)&local_d8,*puVar2);
          break;
        default:
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0xaef);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        std::__cxx11::string::_M_append((char *)&local_d8,shader_end_abi_cxx11_);
        (*(local_108->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
          super_TestNode._vptr_TestNode[8])(local_108,(ulong)tested_shader_type,&local_d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      lVar6 = lVar6 + 0x20;
    } while (local_138 != lVar6);
    lVar3 = local_110 + 1;
    psVar7 = psVar7 + 4;
    local_138 = local_138 + -0x20;
  } while (lVar3 != 4);
  lVar3 = -0x80;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ExpressionsAssignment2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_body("    float a[2] = float[](1.0, 2.0);\n"
							"    float b[2][2] = float[][](float[](1.0, 2.0), float[](1.0, 2.0));\n"
							"    float c[2][2][2] = float[][][]("
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)),"
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)));\n"
							"    float d[2][2][2][2] = float[][][][]("
							"float[][][]("
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)), "
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0))),"
							"float[][][]("
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0)), "
							"float[][](float[](1.0, 2.0), float[](1.0, 2.0))));\n\n");

	std::string variable_basenames[] = { "a", "b", "c", "d" };
	int			number_of_elements   = sizeof(variable_basenames) / sizeof(variable_basenames[0]);

	for (int variable_index = 0; variable_index < number_of_elements; variable_index++)
	{
		for (int value_index = variable_index; value_index < number_of_elements; value_index++)
		{
			std::string shader_source = shader_start + shader_body;

			/* Avoid the situation when a variable is assign to itself. */
			if (variable_index != value_index)
			{
				shader_source += "    " + variable_basenames[variable_index] + " = " + variable_basenames[value_index];
				shader_source += ";\n";

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				this->execute_negative_test(tested_shader_type, shader_source);
			} /* if(variable_index != value_index) */
		}	 /* for (int value_index = variable_index; ...) */
	}		  /* for (int variable_index = 0; ...) */
}